

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlRpcValue.cpp
# Opt level: O3

void __thiscall XmlRpc::XmlRpcValue::invalidate(XmlRpcValue *this)

{
  void *pvVar1;
  ulong uVar2;
  tm *this_00;
  
  switch(this->_type) {
  case TypeString:
    this_00 = (tm *)(this->_value).asBinary;
    if (this_00 != (tm *)0x0) {
      if ((int *)*(undefined1 **)this_00 != &this_00->tm_mon) {
        operator_delete(*(undefined1 **)this_00,
                        (ulong)((long)&(*(_Base_ptr *)&this_00->tm_mon)->_M_color + 1));
      }
    }
    uVar2 = 0x20;
    break;
  case TypeDateTime:
    this_00 = (this->_value).asTime;
    uVar2 = 0x38;
    break;
  case TypeBase64:
    this_00 = (tm *)(this->_value).asBinary;
    if ((this_00 != (tm *)0x0) && (pvVar1 = *(void **)this_00, pvVar1 != (void *)0x0)) {
      operator_delete(pvVar1,(long)*(_Base_ptr *)&this_00->tm_mon - (long)pvVar1);
    }
    goto LAB_0024df10;
  case TypeArray:
    this_00 = (this->_value).asTime;
    if (this_00 != (tm *)0x0) {
      std::vector<XmlRpc::XmlRpcValue,_std::allocator<XmlRpc::XmlRpcValue>_>::~vector
                ((vector<XmlRpc::XmlRpcValue,_std::allocator<XmlRpc::XmlRpcValue>_> *)this_00);
    }
LAB_0024df10:
    uVar2 = 0x18;
    break;
  case TypeStruct:
    this_00 = (this->_value).asTime;
    if (this_00 != (tm *)0x0) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>_>_>
                   *)this_00);
    }
    uVar2 = 0x30;
    break;
  default:
    goto switchD_0024de9f_default;
  }
  operator_delete(this_00,uVar2);
switchD_0024de9f_default:
  this->_type = TypeInvalid;
  (this->_value).asDouble = 0.0;
  return;
}

Assistant:

void XmlRpcValue::invalidate()
  {
    switch (_type) {
      case TypeString:    delete _value.asString; break;
      case TypeDateTime:  delete _value.asTime;   break;
      case TypeBase64:    delete _value.asBinary; break;
      case TypeArray:     delete _value.asArray;  break;
      case TypeStruct:    delete _value.asStruct; break;
      default: break;
    }
    _type = TypeInvalid;
    _value.asBinary = 0;
  }